

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void MakeRandDeterministicDANGEROUS(uint256 *seed)

{
  RNGState *mutexIn;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  Span<const_std::byte> local_38;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = anon_unknown.dwarf_4b408c::GetRNGState();
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_28,&mutexIn->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/random.cpp",
             0x1dc,false);
  local_38.m_size = 0x20;
  local_38.m_data = (byte *)seed;
  std::optional<ChaCha20>::emplace<Span<std::byte_const>>(&mutexIn->m_deterministic_prng,&local_38);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeRandDeterministicDANGEROUS(const uint256& seed) noexcept
{
    GetRNGState().MakeDeterministic(seed);
}